

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O2

IterateResult __thiscall gl3cts::TextureSizePromotion::FunctionalTest::iterate(FunctionalTest *this)

{
  ostringstream *poVar1;
  uint target;
  bool bVar2;
  bool bVar3;
  ContextType ctxType;
  GLuint GVar4;
  long lVar5;
  char *description;
  TestContext *this_00;
  byte bVar6;
  GLuint k;
  ColorChannelSelector channel;
  TextureInternalFormatDescriptor *pTVar7;
  long lVar8;
  undefined1 local_1b0 [384];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_texture_storage_multisample");
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x113);
  if (bVar3) {
    prepareVertexArrayObject(this);
    bVar6 = 1;
    for (lVar8 = 0; lVar8 != 0x44; lVar8 = lVar8 + 1) {
      bVar3 = glu::contextSupports(ctxType,(ApiType)((&s_formats)[lVar8 * 0x10] & 0x3ff));
      if (bVar3) {
        pTVar7 = (TextureInternalFormatDescriptor *)(&s_formats + lVar8 * 0x10);
        for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
          target = (&s_source_texture_targets)[lVar5];
          if ((target & 0xfffffffd) == 0x9100) {
            if ((((bVar2) || (bVar3 = glu::contextSupports(ctxType,(ApiType)0x134), bVar3)) &&
                ((&DAT_01db0b61)[lVar8 * 0x40] == '\x01')) &&
               (((&DAT_01db0b8c)[lVar8 * 0x10] == 0 && ((int)(&DAT_01db0b78)[lVar8 * 0x10] < 1)))) {
LAB_009220ca:
              if ((target != 0x806f) || ((int)(&DAT_01db0b78)[lVar8 * 0x10] < 1)) goto LAB_009220de;
            }
          }
          else {
            if ((&DAT_01db0b8c)[lVar8 * 0x10] == 0) goto LAB_009220ca;
            if (target == 0x806f) goto LAB_00922255;
LAB_009220de:
            prepareSourceTexture(this,*pTVar7,target);
            bVar3 = checkSourceTextureSizeAndType(this,*pTVar7,target);
            bVar6 = bVar3 & bVar6;
            for (channel = RED_COMPONENT; channel != COMPONENTS_COUNT;
                channel = channel + GREEN_COMPONENT) {
              prepareDestinationTextureAndFramebuffer(this,*pTVar7,0xde1);
              GVar4 = prepareProgram(this,target,*pTVar7,channel);
              this->m_program = GVar4;
              makeProgramAndSourceTextureActive(this,target);
              drawQuad(this);
              bVar3 = checkDestinationTexture
                                (this,*pTVar7,channel,target,
                                 *(GLchar **)(s_source_texture_targets_names + lVar5 * 8));
              cleanDestinationTexture(this);
              cleanFramebuffer(this);
              cleanProgram(this);
              bVar6 = bVar6 & bVar3;
            }
            cleanSourceTexture(this);
          }
LAB_00922255:
        }
      }
    }
  }
  else {
    bVar6 = 1;
  }
  cleanSourceTexture(this);
  cleanDestinationTexture(this);
  cleanFramebuffer(this);
  cleanProgram(this);
  cleanVertexArrayObject(this);
  if (bVar6 == 0) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Texture Size Promotion Test have failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Fail";
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Texture Size Promotion Test have passed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this_00,(uint)(bVar6 == 0),description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	/* Get context setup. */
	glu::ContextType context_type = m_context.getRenderContext().getType();
	bool			 is_arb_texture_storage_multisample =
		m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_storage_multisample");

	/* Prepare initial results. */
	bool is_ok	 = true;
	bool was_error = false;

	/* Iterate over test cases. */
	try
	{
		/* Only for OpenGL 3.1 context. */
		if (glu::contextSupports(context_type, glu::ApiType::core(3, 1)))
		{
			/* Generate and bind VAO. */
			prepareVertexArrayObject();

			/* For every required format */
			for (glw::GLuint i = 0; i < s_formats_size; ++i)
			{
				/* Test only if format is required by context. */
				if (glu::contextSupports(context_type, s_formats[i].required_by_context.getAPI()))
				{
					/* For every target. */
					for (glw::GLuint j = 0; j < s_source_texture_targets_count; ++j)
					{
						/* Test if it is supported by context or internal format. */
						if (isTargetMultisampled(s_source_texture_targets[j]))
						{
							if ((!is_arb_texture_storage_multisample) &&
								(!glu::contextSupports(context_type, glu::ApiType::core(4, 3))))
							{
								continue;
							}

							if (!s_formats[i]
									 .is_color_renderable) /* Multisampled textures need to be set using rendering. */
							{
								continue;
							}

							if (isDepthType(s_formats[i]) || isStencilType(s_formats[i]))
							{
								continue;
							}
						}

						if ((isDepthType(s_formats[i]) || isStencilType(s_formats[i])) &&
							(GL_TEXTURE_3D == s_source_texture_targets[j]))
						{
							continue;
						}

						/* Prepare source texture to be tested. */
						prepareSourceTexture(s_formats[i], s_source_texture_targets[j]);

						/* Check basic API queries for source texture. */
						is_ok = is_ok & checkSourceTextureSizeAndType(s_formats[i], s_source_texture_targets[j]);

						/* For every [R, G, B, A] component. */
						for (glw::GLuint k = 0; k < COMPONENTS_COUNT; ++k)
						{
							/* Prepare destination texture. */
							prepareDestinationTextureAndFramebuffer(s_formats[i], GL_TEXTURE_2D);

							/* Building program (throws on failure). */
							m_program =
								prepareProgram(s_source_texture_targets[j], s_formats[i], ColorChannelSelector(k));

							/* Setup GL and draw. */
							makeProgramAndSourceTextureActive(s_source_texture_targets[j]);

							drawQuad();

							/* Check results. */
							is_ok = is_ok & checkDestinationTexture(s_formats[i], ColorChannelSelector(k),
																	s_source_texture_targets[j],
																	s_source_texture_targets_names[j]);

							/* Cleanup. */
							cleanDestinationTexture();
							cleanFramebuffer();
							cleanProgram();
						}

						cleanSourceTexture();
					}
				}
			}
		}
	}
	catch (...)
	{
		/* Error have occured. */
		is_ok	 = false;
		was_error = true;
	}

	/* Clean all. */

	cleanSourceTexture();
	cleanDestinationTexture();
	cleanFramebuffer();
	cleanProgram();
	cleanVertexArrayObject();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Texture Size Promotion Test have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (was_error)
		{
			/* Log error. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Texture Size Promotion Test have approached error."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			/* Log fail. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Texture Size Promotion Test have failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	/* End test. */
	return tcu::TestNode::STOP;
}